

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes__trefoil(float *uv,float *xyz,void *userdata)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  float local_70;
  float local_6c;
  float ww [3];
  float qvn [3];
  float q [3];
  float z;
  float y;
  float x;
  float r;
  float v;
  float u;
  float d;
  float c;
  float b;
  float a;
  float minor;
  void *userdata_local;
  float *xyz_local;
  float *uv_local;
  
  fVar3 = *userdata * 0.1;
  fVar1 = (1.0 - *uv) * 4.0 * 3.1415927;
  fVar2 = uv[1] * 2.0 * 3.1415927;
  dVar5 = cos((double)(fVar1 * 1.5));
  fVar4 = (float)(dVar5 * 0.30000001192092896 + 0.5);
  dVar5 = cos((double)fVar1);
  dVar6 = sin((double)fVar1);
  dVar7 = sin((double)(fVar1 * 1.5));
  dVar8 = sin((double)(fVar1 * 1.5));
  dVar9 = cos((double)fVar1);
  dVar10 = cos((double)(fVar1 * 1.5));
  dVar11 = sin((double)fVar1);
  qvn[1] = (float)(dVar8 * -0.45000001788139343 * dVar9 +
                  -((dVar10 * 0.30000001192092896 + 0.5) * dVar11));
  dVar8 = sin((double)(fVar1 * 1.5));
  dVar9 = sin((double)fVar1);
  dVar10 = cos((double)(fVar1 * 1.5));
  dVar11 = cos((double)fVar1);
  qvn[2] = (float)(dVar8 * -0.45000001788139343 * dVar9 +
                  (dVar10 * 0.30000001192092896 + 0.5) * dVar11);
  cos((double)(fVar1 * 1.5));
  par_shapes__normalize3(qvn + 1);
  ww[1] = qvn[2];
  ww[2] = -qvn[1];
  qvn[0] = 0.0;
  par_shapes__normalize3(ww + 1);
  par_shapes__cross3(&local_70,qvn + 1,ww + 1);
  dVar8 = (double)ww[1];
  dVar9 = cos((double)fVar2);
  dVar10 = sin((double)fVar2);
  *xyz = (float)((double)fVar3 * (dVar8 * dVar9 + (double)local_70 * dVar10) +
                (double)(float)((double)fVar4 * dVar5));
  dVar5 = (double)ww[2];
  dVar8 = cos((double)fVar2);
  dVar9 = sin((double)fVar2);
  xyz[1] = (float)((double)fVar3 * (dVar5 * dVar8 + (double)local_6c * dVar9) +
                  (double)(float)((double)fVar4 * dVar6));
  dVar5 = sin((double)fVar2);
  xyz[2] = (float)((double)(fVar3 * ww[0]) * dVar5 + (double)(float)(dVar7 * 0.5));
  return;
}

Assistant:

static void par_shapes__trefoil(float const* uv, float* xyz, void* userdata)
{
    float minor = *((float*) userdata);
    const float a = 0.5f;
    const float b = 0.3f;
    const float c = 0.5f;
    const float d = minor * 0.1f;
    const float u = (1 - uv[0]) * 4 * PAR_PI;
    const float v = uv[1] * 2 * PAR_PI;
    const float r = a + b * cos(1.5f * u);
    const float x = r * cos(u);
    const float y = r * sin(u);
    const float z = c * sin(1.5f * u);
    float q[3];
    q[0] =
        -1.5f * b * sin(1.5f * u) * cos(u) - (a + b * cos(1.5f * u)) * sin(u);
    q[1] =
        -1.5f * b * sin(1.5f * u) * sin(u) + (a + b * cos(1.5f * u)) * cos(u);
    q[2] = 1.5f * c * cos(1.5f * u);
    par_shapes__normalize3(q);
    float qvn[3] = {q[1], -q[0], 0};
    par_shapes__normalize3(qvn);
    float ww[3];
    par_shapes__cross3(ww, q, qvn);
    xyz[0] = x + d * (qvn[0] * cos(v) + ww[0] * sin(v));
    xyz[1] = y + d * (qvn[1] * cos(v) + ww[1] * sin(v));
    xyz[2] = z + d * ww[2] * sin(v);
}